

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

ImDrawChannel * __thiscall
ImVector<ImDrawChannel>::insert(ImVector<ImDrawChannel> *this,ImDrawChannel *it,ImDrawChannel *v)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  ImDrawChannel *pIVar4;
  ptrdiff_t off;
  ImDrawChannel *v_local;
  ImDrawChannel *it_local;
  ImVector<ImDrawChannel> *this_local;
  
  bVar1 = false;
  if (this->Data <= it) {
    bVar1 = it <= this->Data + this->Size;
  }
  if (!bVar1) {
    __assert_fail("it >= Data && it <= Data+Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/./imgui/imgui.h"
                  ,0x4f2,
                  "T *ImVector<ImDrawChannel>::insert(const T *, const T &) [T = ImDrawChannel]");
  }
  lVar3 = (long)it - (long)this->Data >> 5;
  if (this->Size == this->Capacity) {
    iVar2 = _grow_capacity(this,this->Size + 1);
    reserve(this,iVar2);
  }
  if (lVar3 < this->Size) {
    memmove(this->Data + lVar3 + 1,this->Data + lVar3,(this->Size - lVar3) * 0x20);
  }
  pIVar4 = this->Data + lVar3;
  iVar2 = (v->_CmdBuffer).Capacity;
  (pIVar4->_CmdBuffer).Size = (v->_CmdBuffer).Size;
  (pIVar4->_CmdBuffer).Capacity = iVar2;
  (pIVar4->_CmdBuffer).Data = (v->_CmdBuffer).Data;
  iVar2 = (v->_IdxBuffer).Capacity;
  (pIVar4->_IdxBuffer).Size = (v->_IdxBuffer).Size;
  (pIVar4->_IdxBuffer).Capacity = iVar2;
  (pIVar4->_IdxBuffer).Data = (v->_IdxBuffer).Data;
  this->Size = this->Size + 1;
  return this->Data + lVar3;
}

Assistant:

inline T*           insert(const T* it, const T& v)     { IM_ASSERT(it >= Data && it <= Data+Size); const ptrdiff_t off = it - Data; if (Size == Capacity) reserve(_grow_capacity(Size + 1)); if (off < (int)Size) memmove(Data + off + 1, Data + off, ((size_t)Size - (size_t)off) * sizeof(T)); memcpy(&Data[off], &v, sizeof(v)); Size++; return Data + off; }